

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_type.cpp
# Opt level: O2

string * __thiscall
duckdb::ExpressionTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ExpressionType type)

{
  int iVar1;
  char *pcVar2;
  allocator local_9;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 0x4b:
    pcVar2 = "CONSTANT";
    break;
  case 0x4c:
    pcVar2 = "PARAMETER";
    break;
  case 0x4d:
    pcVar2 = "TUPLE";
    break;
  case 0x4e:
    pcVar2 = "TUPLE_ADDRESS";
    break;
  case 0x4f:
    pcVar2 = "NULL";
    break;
  case 0x50:
    pcVar2 = "VECTOR";
    break;
  case 0x51:
    pcVar2 = "SCALAR";
    break;
  case 0x52:
    pcVar2 = "VALUE_DEFAULT";
    break;
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
    goto switchD_01260e40_caseD_11;
  case 100:
    pcVar2 = "AGGREGATE";
    break;
  case 0x65:
    pcVar2 = "BOUND_AGGREGATE";
    break;
  case 0x66:
    pcVar2 = "GROUPING";
    break;
  case 0x6e:
    pcVar2 = "WINDOW_AGGREGATE";
    break;
  case 0x78:
    pcVar2 = "RANK";
    break;
  case 0x79:
    pcVar2 = "RANK_DENSE";
    break;
  case 0x7a:
    pcVar2 = "NTILE";
    break;
  case 0x7b:
    pcVar2 = "PERCENT_RANK";
    break;
  case 0x7c:
    pcVar2 = "CUME_DIST";
    break;
  case 0x7d:
    pcVar2 = "ROW_NUMBER";
    break;
  case 0x82:
    pcVar2 = "FIRST_VALUE";
    break;
  case 0x83:
    pcVar2 = "LAST_VALUE";
    break;
  case 0x84:
    pcVar2 = "LEAD";
    break;
  case 0x85:
    pcVar2 = "LAG";
    break;
  case 0x86:
    pcVar2 = "NTH_VALUE";
    break;
  case 0x8c:
    pcVar2 = "FUNCTION";
    break;
  case 0x8d:
    pcVar2 = "BOUND_FUNCTION";
    break;
  case 0x96:
    pcVar2 = "CASE";
    break;
  case 0x97:
    pcVar2 = "NULLIF";
    break;
  case 0x98:
    pcVar2 = "COALESCE";
    break;
  case 0x99:
    pcVar2 = "ARRAY_EXTRACT";
    break;
  case 0x9a:
    pcVar2 = "ARRAY_SLICE";
    break;
  case 0x9b:
    pcVar2 = "STRUCT_EXTRACT";
    break;
  case 0x9c:
    pcVar2 = "ARRAY_CONSTRUCTOR";
    break;
  case 0x9d:
    pcVar2 = "ARROW";
    break;
  case 0x9e:
    pcVar2 = "TRY";
    break;
  default:
    switch(iVar1) {
    case 0xc:
switchD_01260e40_caseD_c:
      pcVar2 = "CAST";
      break;
    case 0xd:
      pcVar2 = "NOT";
      break;
    case 0xe:
      pcVar2 = "IS_NULL";
      break;
    case 0xf:
      pcVar2 = "IS_NOT_NULL";
      break;
    case 0x10:
      pcVar2 = "UNPACK";
      break;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
      goto switchD_01260e40_caseD_11;
    case 0x19:
      pcVar2 = "EQUAL";
      break;
    case 0x1a:
      pcVar2 = "NOTEQUAL";
      break;
    case 0x1b:
      pcVar2 = "LESSTHAN";
      break;
    case 0x1c:
      pcVar2 = "GREATERTHAN";
      break;
    case 0x1d:
      pcVar2 = "LESSTHANOREQUALTO";
      break;
    case 0x1e:
      pcVar2 = "GREATERTHANOREQUALTO";
      break;
    case 0x23:
      pcVar2 = "IN";
      break;
    case 0x24:
      pcVar2 = "COMPARE_NOT_IN";
      break;
    case 0x25:
      pcVar2 = "DISTINCT_FROM";
      break;
    case 0x26:
      pcVar2 = "COMPARE_BETWEEN";
      break;
    case 0x27:
      pcVar2 = "COMPARE_NOT_BETWEEN";
      break;
    case 0x28:
      pcVar2 = "NOT_DISTINCT_FROM";
      break;
    case 0x32:
      pcVar2 = "AND";
      break;
    case 0x33:
      pcVar2 = "OR";
      break;
    default:
      switch(iVar1) {
      case 200:
        pcVar2 = "STAR";
        break;
      case 0xc9:
        pcVar2 = "TABLE_STAR";
        break;
      case 0xca:
        pcVar2 = "PLACEHOLDER";
        break;
      case 0xcb:
        pcVar2 = "COLUMN_REF";
        break;
      case 0xcc:
        pcVar2 = "FUNCTION_REF";
        break;
      case 0xcd:
        pcVar2 = "TABLE_REF";
        break;
      case 0xce:
        pcVar2 = "LAMBDA_REF";
        break;
      case 0xe1:
        goto switchD_01260e40_caseD_c;
      case 0xe3:
        pcVar2 = "BOUND_REF";
        break;
      case 0xe4:
        pcVar2 = "BOUND_COLUMN_REF";
        break;
      case 0xe5:
        pcVar2 = "BOUND_UNNEST";
        break;
      case 0xe6:
        pcVar2 = "COLLATE";
        break;
      case 0xe7:
        pcVar2 = "LAMBDA";
        break;
      case 0xe8:
        pcVar2 = "POSITIONAL_REFERENCE";
        break;
      case 0xe9:
        pcVar2 = "BOUND_LAMBDA_REF";
        break;
      case 0xea:
        pcVar2 = "BOUND_EXPANDED";
        break;
      default:
        if (iVar1 == 0xaf) {
          pcVar2 = "SUBQUERY";
          break;
        }
      case 0xcf:
      case 0xd0:
      case 0xd1:
      case 0xd2:
      case 0xd3:
      case 0xd4:
      case 0xd5:
      case 0xd6:
      case 0xd7:
      case 0xd8:
      case 0xd9:
      case 0xda:
      case 0xdb:
      case 0xdc:
      case 0xdd:
      case 0xde:
      case 0xdf:
      case 0xe0:
      case 0xe2:
switchD_01260e40_caseD_11:
        pcVar2 = "INVALID";
      }
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string ExpressionTypeToString(ExpressionType type) {
	switch (type) {
	case ExpressionType::OPERATOR_CAST:
		return "CAST";
	case ExpressionType::OPERATOR_NOT:
		return "NOT";
	case ExpressionType::OPERATOR_IS_NULL:
		return "IS_NULL";
	case ExpressionType::OPERATOR_IS_NOT_NULL:
		return "IS_NOT_NULL";
	case ExpressionType::OPERATOR_UNPACK:
		return "UNPACK";
	case ExpressionType::COMPARE_EQUAL:
		return "EQUAL";
	case ExpressionType::COMPARE_NOTEQUAL:
		return "NOTEQUAL";
	case ExpressionType::COMPARE_LESSTHAN:
		return "LESSTHAN";
	case ExpressionType::COMPARE_GREATERTHAN:
		return "GREATERTHAN";
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return "LESSTHANOREQUALTO";
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return "GREATERTHANOREQUALTO";
	case ExpressionType::COMPARE_IN:
		return "IN";
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return "DISTINCT_FROM";
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		return "NOT_DISTINCT_FROM";
	case ExpressionType::CONJUNCTION_AND:
		return "AND";
	case ExpressionType::CONJUNCTION_OR:
		return "OR";
	case ExpressionType::VALUE_CONSTANT:
		return "CONSTANT";
	case ExpressionType::VALUE_PARAMETER:
		return "PARAMETER";
	case ExpressionType::VALUE_TUPLE:
		return "TUPLE";
	case ExpressionType::VALUE_TUPLE_ADDRESS:
		return "TUPLE_ADDRESS";
	case ExpressionType::VALUE_NULL:
		return "NULL";
	case ExpressionType::VALUE_VECTOR:
		return "VECTOR";
	case ExpressionType::VALUE_SCALAR:
		return "SCALAR";
	case ExpressionType::AGGREGATE:
		return "AGGREGATE";
	case ExpressionType::WINDOW_AGGREGATE:
		return "WINDOW_AGGREGATE";
	case ExpressionType::WINDOW_RANK:
		return "RANK";
	case ExpressionType::WINDOW_RANK_DENSE:
		return "RANK_DENSE";
	case ExpressionType::WINDOW_PERCENT_RANK:
		return "PERCENT_RANK";
	case ExpressionType::WINDOW_ROW_NUMBER:
		return "ROW_NUMBER";
	case ExpressionType::WINDOW_FIRST_VALUE:
		return "FIRST_VALUE";
	case ExpressionType::WINDOW_LAST_VALUE:
		return "LAST_VALUE";
	case ExpressionType::WINDOW_NTH_VALUE:
		return "NTH_VALUE";
	case ExpressionType::WINDOW_CUME_DIST:
		return "CUME_DIST";
	case ExpressionType::WINDOW_LEAD:
		return "LEAD";
	case ExpressionType::WINDOW_LAG:
		return "LAG";
	case ExpressionType::WINDOW_NTILE:
		return "NTILE";
	case ExpressionType::FUNCTION:
		return "FUNCTION";
	case ExpressionType::CASE_EXPR:
		return "CASE";
	case ExpressionType::OPERATOR_NULLIF:
		return "NULLIF";
	case ExpressionType::OPERATOR_COALESCE:
		return "COALESCE";
	case ExpressionType::OPERATOR_TRY:
		return "TRY";
	case ExpressionType::ARRAY_EXTRACT:
		return "ARRAY_EXTRACT";
	case ExpressionType::ARRAY_SLICE:
		return "ARRAY_SLICE";
	case ExpressionType::STRUCT_EXTRACT:
		return "STRUCT_EXTRACT";
	case ExpressionType::SUBQUERY:
		return "SUBQUERY";
	case ExpressionType::STAR:
		return "STAR";
	case ExpressionType::PLACEHOLDER:
		return "PLACEHOLDER";
	case ExpressionType::COLUMN_REF:
		return "COLUMN_REF";
	case ExpressionType::LAMBDA_REF:
		return "LAMBDA_REF";
	case ExpressionType::FUNCTION_REF:
		return "FUNCTION_REF";
	case ExpressionType::TABLE_REF:
		return "TABLE_REF";
	case ExpressionType::CAST:
		return "CAST";
	case ExpressionType::COMPARE_NOT_IN:
		return "COMPARE_NOT_IN";
	case ExpressionType::COMPARE_BETWEEN:
		return "COMPARE_BETWEEN";
	case ExpressionType::COMPARE_NOT_BETWEEN:
		return "COMPARE_NOT_BETWEEN";
	case ExpressionType::VALUE_DEFAULT:
		return "VALUE_DEFAULT";
	case ExpressionType::BOUND_REF:
		return "BOUND_REF";
	case ExpressionType::BOUND_COLUMN_REF:
		return "BOUND_COLUMN_REF";
	case ExpressionType::BOUND_FUNCTION:
		return "BOUND_FUNCTION";
	case ExpressionType::BOUND_AGGREGATE:
		return "BOUND_AGGREGATE";
	case ExpressionType::GROUPING_FUNCTION:
		return "GROUPING";
	case ExpressionType::ARRAY_CONSTRUCTOR:
		return "ARRAY_CONSTRUCTOR";
	case ExpressionType::TABLE_STAR:
		return "TABLE_STAR";
	case ExpressionType::BOUND_UNNEST:
		return "BOUND_UNNEST";
	case ExpressionType::COLLATE:
		return "COLLATE";
	case ExpressionType::POSITIONAL_REFERENCE:
		return "POSITIONAL_REFERENCE";
	case ExpressionType::BOUND_LAMBDA_REF:
		return "BOUND_LAMBDA_REF";
	case ExpressionType::LAMBDA:
		return "LAMBDA";
	case ExpressionType::ARROW:
		return "ARROW";
	case ExpressionType::BOUND_EXPANDED:
		return "BOUND_EXPANDED";
	case ExpressionType::INVALID:
		break;
	}
	return "INVALID";
}